

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxSoundCast::Emit(FxSoundCast *this,VMFunctionBuilder *build)

{
  uint uVar1;
  uint uVar2;
  uint extraout_var;
  ExpEmit EVar3;
  
  uVar1 = (*this->basex->_vptr_FxExpression[9])();
  if ((extraout_var & 1) != 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x552,"virtual ExpEmit FxSoundCast::Emit(VMFunctionBuilder *)");
  }
  if (this->basex->ValueType == (PType *)TypeString) {
    if ((CONCAT44(extraout_var,uVar1) & 0x10000fc0000) == 0) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + ((uint)(CONCAT44(extraout_var,uVar1) >> 0x10) & 3),
                 uVar1 & 0xffff,uVar1 >> 0x18);
    }
    uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    VMFunctionBuilder::Emit(build,0x3e,uVar2 & 0xffff,uVar1 & 0xffff,0xd);
    EVar3._0_4_ = uVar2 & 0xffff | 0x1000000;
    EVar3.Konst = false;
    EVar3.Fixed = false;
    EVar3.Final = false;
    EVar3.Target = false;
    return EVar3;
  }
  __assert_fail("basex->ValueType == TypeString",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x553,"virtual ExpEmit FxSoundCast::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxSoundCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);
	assert(basex->ValueType == TypeString);
	from.Free(build);
	ExpEmit to(build, REGT_INT);
	build->Emit(OP_CAST, to.RegNum, from.RegNum, CAST_S2So);
	return to;
}